

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O0

int __thiscall HttpTestListener::Start(HttpTestListener *this)

{
  int iVar1;
  undefined4 local_2c;
  undefined1 local_28 [4];
  int opt;
  sockaddr_in addr;
  HttpTestListener *this_local;
  
  addr.sin_zero = (uchar  [8])this;
  memset(local_28,0,0x10);
  iVar1 = socket(2,1,6);
  this->fd_ = iVar1;
  opt = inet_addr("127.0.0.1");
  local_28._2_2_ = htons((uint16_t)this->local_port_);
  local_28._0_2_ = 2;
  local_2c = 1;
  setsockopt(this->fd_,1,2,&local_2c,4);
  iVar1 = bind(this->fd_,(sockaddr *)local_28,0x10);
  if (iVar1 == 0) {
    iVar1 = listen(this->fd_,5);
    if (iVar1 == 0) {
      pthread_create(&this->thread_,(pthread_attr_t *)0x0,ResponseHandleRun,this);
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int HttpTestListener::Start() {
  sockaddr_in addr = {};
  fd_ = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
  addr.sin_addr.s_addr = inet_addr("127.0.0.1");
  addr.sin_port = htons(local_port_);
  addr.sin_family = AF_INET;
  int opt=1;
  setsockopt(fd_,SOL_SOCKET,SO_REUSEADDR,&opt,sizeof(opt));
  if(bind(fd_, (struct sockaddr *)&addr, sizeof(sockaddr_in)) != 0) {
    return -1;
  }
  if(listen(fd_, 5) != 0) {
    return -1;
  }

  pthread_create(&thread_, NULL, ResponseHandleRun, this);

  return 0;
}